

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O2

int message_queue_add(MESSAGE_QUEUE_HANDLE message_queue,MQ_MESSAGE_HANDLE message,
                     MESSAGE_PROCESSING_COMPLETED_CALLBACK on_message_processing_completed_callback,
                     void *user_context)

{
  uint32_t uVar1;
  LOGGER_LOG p_Var2;
  uint32_t *__ptr;
  time_t tVar3;
  LIST_ITEM_HANDLE pLVar4;
  int iVar5;
  
  if (message_queue == (MESSAGE_QUEUE_HANDLE)0x0 || message == (MQ_MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar5 = 0x1fc;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                ,"message_queue_add",0x1fb,1,"invalid argument (message_queue=%p, message=%p)",
                message_queue,message);
    }
  }
  else {
    __ptr = (uint32_t *)calloc(1,0x38);
    if (__ptr == (uint32_t *)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar5 = 0x205;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                  ,"message_queue_add",0x204,1,"failed creating container for message");
      }
    }
    else {
      tVar3 = get_time((time_t *)0x0);
      *(time_t *)(__ptr + 8) = tVar3;
      if (tVar3 == -1) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                    ,"message_queue_add",0x20d,1,"failed setting message enqueue time");
        }
        free(__ptr);
        iVar5 = 0x20f;
      }
      else {
        pLVar4 = singlylinkedlist_add(message_queue->pending,__ptr);
        if (pLVar4 == (LIST_ITEM_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                      ,"message_queue_add",0x213,1,"failed enqueuing message");
          }
          free(__ptr);
          iVar5 = 0x215;
        }
        else {
          uVar1 = message_queue->id_counter;
          message_queue->id_counter = uVar1 + 1;
          *__ptr = uVar1;
          *(MQ_MESSAGE_HANDLE *)(__ptr + 2) = message;
          *(MESSAGE_PROCESSING_COMPLETED_CALLBACK *)(__ptr + 4) =
               on_message_processing_completed_callback;
          *(void **)(__ptr + 6) = user_context;
          __ptr[10] = 0xffffffff;
          __ptr[0xb] = 0xffffffff;
          iVar5 = 0;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int message_queue_add(MESSAGE_QUEUE_HANDLE message_queue, MQ_MESSAGE_HANDLE message, MESSAGE_PROCESSING_COMPLETED_CALLBACK on_message_processing_completed_callback, void* user_context)
{
    int result;

    if (message_queue == NULL || message == NULL)
    {
        LogError("invalid argument (message_queue=%p, message=%p)", message_queue, message);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_QUEUE_ITEM* mq_item;

        if ((mq_item = (MESSAGE_QUEUE_ITEM*)malloc(sizeof(MESSAGE_QUEUE_ITEM))) == NULL)
        {
            LogError("failed creating container for message");
            result = MU_FAILURE;
        }
        else
        {
            memset(mq_item, 0, sizeof(MESSAGE_QUEUE_ITEM));

            if ((mq_item->enqueue_time = get_time(NULL)) == INDEFINITE_TIME)
            {
                LogError("failed setting message enqueue time");
                free(mq_item);
                result = MU_FAILURE;
            }
            else if (singlylinkedlist_add(message_queue->pending, (const void*)mq_item) == NULL)
            {
                LogError("failed enqueuing message");
                free(mq_item);
                result = MU_FAILURE;
            }
            else
            {
                mq_item->id = message_queue->id_counter++;
                mq_item->message = message;
                mq_item->on_message_processing_completed_callback = on_message_processing_completed_callback;
                mq_item->user_context = user_context;
                mq_item->processing_start_time = INDEFINITE_TIME;
                result = RESULT_OK;
            }
        }
    }

    return result;
}